

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O1

wchar_t archive_read_format_lha_read_data(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  lzh_br *br;
  long lVar1;
  void *__src;
  char cVar2;
  ushort uVar3;
  long *plVar4;
  long *plVar5;
  long lVar6;
  int *piVar7;
  undefined4 *puVar8;
  uint64_t uVar9;
  uint16_t uVar10;
  wchar_t wVar11;
  wchar_t wVar12;
  void *pvVar13;
  ulong uVar14;
  int *piVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  uint uVar21;
  wchar_t tbl_bits;
  wchar_t tbl_bits_00;
  ulong uVar22;
  char *fmt;
  int iVar23;
  uint uVar24;
  uint uVar25;
  huffman_conflict *phVar27;
  int iVar28;
  byte bVar29;
  huffman_conflict *hf;
  size_t len;
  byte bVar30;
  lzh_br local_e8;
  long local_d8;
  lzh_stream *local_d0;
  long *local_c8;
  int local_bc;
  uint local_b8;
  uint local_b4;
  void **local_b0;
  long *local_a8;
  int *local_a0;
  int *local_98;
  huffman_conflict *local_90;
  huffman_conflict *local_88;
  size_t *local_80;
  long local_78;
  long local_70;
  int *local_68;
  long local_60;
  long local_58;
  archive_read *local_50;
  int *local_48;
  undefined1 *local_40;
  long local_38;
  ushort *puVar26;
  
  plVar4 = (long *)a->format->data;
  local_b0 = buff;
  local_a8 = offset;
  if (plVar4[2] != 0) {
    __archive_read_consume(a,plVar4[2]);
    plVar4[2] = 0;
  }
  if (*(char *)((long)plVar4 + 300) != '\0') {
    *local_a8 = *plVar4;
    *size = 0;
    *local_b0 = (void *)0x0;
    wVar11 = lha_end_of_entry(a);
    return wVar11;
  }
  plVar5 = (long *)a->format->data;
  local_c8 = plVar5;
  if (*(char *)((long)plVar4 + 0x12e) == '\0') {
    if (plVar5[1] == 0) {
      *local_b0 = (void *)0x0;
      *size = 0;
      *local_a8 = *plVar5;
      *(undefined1 *)((long)plVar5 + 300) = 1;
      return L'\0';
    }
    pvVar13 = __archive_read_ahead(a,1,(ssize_t *)&local_e8);
    plVar4 = local_c8;
    *local_b0 = pvVar13;
    if (0 < (long)local_e8.cache_buffer) {
      if (local_c8[1] < (long)local_e8.cache_buffer) {
        local_e8.cache_buffer = local_c8[1];
      }
      uVar9 = local_e8.cache_buffer;
      uVar10 = lha_crc16(*(uint16_t *)(local_c8 + 3),pvVar13,local_e8.cache_buffer);
      *(uint16_t *)(plVar4 + 3) = uVar10;
      *size = uVar9;
      *local_a8 = *plVar4;
      *plVar4 = *plVar4 + uVar9;
      plVar5 = plVar4 + 1;
      *plVar5 = *plVar5 - local_e8.cache_buffer;
      if (*plVar5 == 0) {
        *(undefined1 *)((long)plVar4 + 300) = 1;
      }
      plVar4[2] = local_e8.cache_buffer;
      return L'\0';
    }
    fmt = "Truncated LHa file data";
  }
  else {
    if (*(char *)((long)plVar5 + 299) == '\0') {
      if (plVar5[0x34] == 0) {
        pvVar13 = calloc(1,0x158);
        plVar5[0x34] = (long)pvVar13;
        if (pvVar13 != (void *)0x0) goto LAB_0014bc79;
        iVar18 = -0x1e;
      }
      else {
LAB_0014bc79:
        puVar8 = (undefined4 *)plVar5[0x34];
        puVar8[0x55] = 0xffffffe7;
        iVar18 = -0x19;
        if ((*(char *)((long)plVar5 + 0x29) == 'l') && (*(char *)((long)plVar5 + 0x2a) == 'h')) {
          cVar2 = *(char *)((long)plVar5 + 0x2b);
          if (cVar2 == '5') {
            bVar29 = 0;
            iVar18 = 0xd;
LAB_0014be29:
            bVar30 = 0;
          }
          else {
            if (cVar2 != '7') {
              if (cVar2 != '6') goto LAB_0014bf10;
              iVar18 = 0xf;
              bVar29 = 1;
              goto LAB_0014be29;
            }
            iVar18 = 0x10;
            bVar30 = 1;
            bVar29 = 0;
          }
          puVar8[0x55] = 0xffffffe2;
          *(undefined8 *)(puVar8 + 1) = 0x1ffff00020000;
          if (*(long *)(puVar8 + 4) == 0) {
            pvVar13 = malloc(0x20000);
            *(void **)(puVar8 + 4) = pvVar13;
            if (pvVar13 != (void *)0x0) goto LAB_0014be62;
          }
          else {
LAB_0014be62:
            uVar14 = (ulong)(uint)(1 << (sbyte)iVar18);
            memset((void *)((*(long *)(puVar8 + 4) - uVar14) + 0x20000),0x20,uVar14);
            puVar8[6] = 0;
            *puVar8 = 0;
            puVar8[0x4f] = iVar18 + 1;
            puVar8[0x50] = (bVar29 | bVar30) | 4;
            *(undefined8 *)(puVar8 + 0x51) = 0x500000013;
            *(undefined8 *)(puVar8 + 10) = 0;
            puVar8[0xc] = 0;
            wVar11 = lzh_huffman_init((huffman_conflict *)(puVar8 + 0xe),0x1fe,tbl_bits);
            iVar18 = -0x1e;
            if (wVar11 == L'\0') {
              puVar8[0x10] = 9;
              wVar11 = lzh_huffman_init((huffman_conflict *)(puVar8 + 0x2e),0x13,tbl_bits_00);
              if (wVar11 == L'\0') {
                puVar8[0x55] = 0;
                iVar18 = 0;
              }
              goto LAB_0014bf10;
            }
          }
          iVar18 = -0x1e;
        }
      }
LAB_0014bf10:
      if (iVar18 != 0) {
        if (iVar18 == -0x19) {
          *local_b0 = (void *)0x0;
          *size = 0;
          *local_a8 = 0;
          archive_set_error(&a->archive,0x54,"Unsupported lzh compression method -%c%c%c-",
                            (ulong)(uint)(int)*(char *)((long)local_c8 + 0x29),
                            (ulong)(uint)(int)*(char *)((long)local_c8 + 0x2a),
                            (ulong)(uint)(int)*(char *)((long)local_c8 + 0x2b));
          archive_read_format_lha_read_data_skip(a);
          return L'\xffffffec';
        }
        fmt = "Couldn\'t allocate memory for lzh decompression";
        iVar18 = 0xc;
        goto LAB_0014bfa0;
      }
      *(undefined1 *)((long)local_c8 + 299) = 1;
      *(undefined4 *)(local_c8 + 0x32) = 0;
      local_c8[0x33] = 0;
    }
    plVar4 = local_c8;
    local_80 = size;
    pvVar13 = __archive_read_ahead(a,1,&local_58);
    plVar4[0x2e] = (long)pvVar13;
    if (0 < local_58) {
      lVar6 = plVar4[1];
      if (lVar6 < local_58) {
        local_58 = lVar6;
      }
      lVar6 = local_58;
      iVar16 = (int)local_58;
      *(int *)(local_c8 + 0x2f) = iVar16;
      local_c8[0x30] = 0;
      *(undefined4 *)(local_c8 + 0x32) = 0;
      iVar18 = ((int *)local_c8[0x34])[0x55];
      if (iVar18 == 0) {
        local_d0 = (lzh_stream *)(local_c8 + 0x2e);
        local_d8 = local_c8[1];
        local_50 = a;
        local_48 = (int *)local_c8[0x34];
LAB_0014ad03:
        piVar7 = (int *)local_c8[0x34];
        if (8 < *local_48) {
          local_68 = piVar7 + 10;
          local_e8.cache_buffer = *(uint64_t *)(piVar7 + 10);
          local_e8.cache_avail = piVar7[0xc];
          local_e8._12_4_ = piVar7[0xd];
          local_90 = *(huffman_conflict **)(piVar7 + 4);
          local_60 = *(long *)(piVar7 + 0x22);
          local_78 = *(long *)(piVar7 + 0x42);
          local_bc = piVar7[0x4e];
          iVar28 = piVar7[8];
          uVar17 = piVar7[7];
          uVar14 = (ulong)(uint)piVar7[6];
          local_b4 = piVar7[2];
          iVar19 = *piVar7;
          uVar21 = piVar7[1];
          local_38 = (long)piVar7[0x24];
          local_70 = (long)piVar7[0x44];
          local_a0 = (int *)(long)(int)uVar21;
          local_40 = (undefined1 *)((long)&local_90->len_size + 1);
          local_b8 = uVar21;
switchD_0014b425_default:
          do {
            switch(iVar19) {
            case 9:
              uVar14 = (ulong)(int)uVar14;
              iVar28 = local_bc;
              do {
                lVar20 = local_38;
                iVar18 = iVar28 + -1;
                if (iVar28 == 0) {
                  *piVar7 = 0;
                  *local_68 = (int)local_e8.cache_buffer;
                  local_68[1] = local_e8.cache_buffer._4_4_;
                  local_68[2] = local_e8.cache_avail;
                  local_68[3] = local_e8._12_4_;
                  piVar7[0x4e] = 0;
                  piVar7[6] = (int)uVar14;
                  piVar7[7] = 0;
                  iVar18 = 100;
                  goto LAB_0014bb86;
                }
                wVar11 = (wchar_t)local_38;
                cVar2 = (char)local_38;
                if (((local_e8.cache_avail < wVar11) &&
                    (wVar12 = lzh_br_fillup(local_d0,&local_e8), wVar12 == L'\0')) &&
                   (local_e8.cache_avail < wVar11)) {
                  if (lVar6 != local_d8) goto LAB_0014ba12;
                  uVar21 = (uint)cache_masks[lVar20] &
                           (uint)(local_e8.cache_buffer <<
                                 (cVar2 - (char)local_e8.cache_avail & 0x3fU));
                  uVar17 = piVar7[0x25];
                  iVar28 = piVar7[0xf];
                  uVar3 = *(ushort *)
                           (*(long *)(piVar7 + 0x2a) + (ulong)(uVar21 >> ((byte)uVar17 & 0x1f)) * 2)
                  ;
                  if (iVar28 == 0 || (int)(uint)uVar3 < iVar28) {
                    uVar25 = (uint)uVar3;
                  }
                  else {
                    uVar24 = (uint)uVar3;
                    do {
                      uVar25 = 0;
                      if (((int)uVar17 < 1) ||
                         (iVar23 = uVar24 - iVar28, uVar25 = 0, piVar7[0x27] <= iVar23)) break;
                      uVar17 = uVar17 - 1;
                      puVar26 = (ushort *)(*(long *)(piVar7 + 0x2c) + 2 + (long)iVar23 * 4);
                      if ((uVar21 >> (uVar17 & 0x1f) & 1) != 0) {
                        puVar26 = (ushort *)(*(long *)(piVar7 + 0x2c) + (long)iVar23 * 4);
                      }
                      uVar25 = (uint)*puVar26;
                      uVar24 = uVar25;
                    } while (iVar28 <= (int)uVar25);
                  }
                  local_e8.cache_avail =
                       local_e8.cache_avail - (uint)*(byte *)(local_60 + (ulong)uVar25);
                  if (local_e8.cache_avail < L'\0') goto LAB_0014ba89;
                }
                else {
                  uVar21 = (uint)cache_masks[lVar20] &
                           (uint)(local_e8.cache_buffer >>
                                 ((char)local_e8.cache_avail - cVar2 & 0x3fU));
                  uVar17 = piVar7[0x25];
                  iVar28 = piVar7[0xf];
                  uVar3 = *(ushort *)
                           (*(long *)(piVar7 + 0x2a) + (ulong)(uVar21 >> ((byte)uVar17 & 0x1f)) * 2)
                  ;
                  if (iVar28 == 0 || (int)(uint)uVar3 < iVar28) {
                    uVar25 = (uint)uVar3;
                  }
                  else {
                    uVar24 = (uint)uVar3;
                    do {
                      uVar25 = 0;
                      if (((int)uVar17 < 1) ||
                         (iVar23 = uVar24 - iVar28, uVar25 = 0, piVar7[0x27] <= iVar23)) break;
                      uVar17 = uVar17 - 1;
                      puVar26 = (ushort *)(*(long *)(piVar7 + 0x2c) + 2 + (long)iVar23 * 4);
                      if ((uVar21 >> (uVar17 & 0x1f) & 1) != 0) {
                        puVar26 = (ushort *)(*(long *)(piVar7 + 0x2c) + (long)iVar23 * 4);
                      }
                      uVar25 = (uint)*puVar26;
                      uVar24 = uVar25;
                    } while (iVar28 <= (int)uVar25);
                  }
                  local_e8.cache_avail =
                       local_e8.cache_avail - (uint)*(byte *)(local_60 + (ulong)uVar25);
                }
                if (0xff < uVar25) goto LAB_0014b5e0;
                *(char *)((long)local_90->freq + (uVar14 - 0xc)) = (char)uVar25;
                uVar14 = uVar14 + 1;
                iVar28 = iVar18;
                if ((long)local_a0 <= (long)uVar14) {
                  local_c8[0x31] = *(long *)(local_c8[0x34] + 0x10);
                  *(int *)(local_c8 + 0x32) = (int)local_a0;
                  local_c8[0x33] = local_c8[0x33] + (long)local_a0;
                  uVar14 = 0;
                  goto LAB_0014ba12;
                }
              } while( true );
            case 10:
              goto switchD_0014b425_caseD_a;
            case 0xb:
              goto switchD_0014b425_caseD_b;
            case 0xc:
              goto switchD_0014b425_caseD_c;
            }
          } while( true );
        }
        br = (lzh_br *)(piVar7 + 10);
        hf = (huffman_conflict *)(piVar7 + 0x2e);
        local_98 = piVar7 + 0x31;
        phVar27 = (huffman_conflict *)(piVar7 + 0xe);
        local_a0 = piVar7 + 0x11;
        local_90 = phVar27;
        local_88 = hf;
switchD_0014ad60_default:
        switch(*piVar7) {
        case 0:
          if ((piVar7[0xc] < 0x10) && (wVar11 = lzh_br_fillup(local_d0,br), wVar11 == L'\0')) {
            iVar18 = 0;
            if (lVar6 != local_d8) goto LAB_0014bb86;
            if (piVar7[0xc] < 8) {
              iVar18 = piVar7[6];
              if ((long)iVar18 < 1) {
                iVar18 = 1;
              }
              else {
                local_c8[0x31] = *(long *)(local_c8[0x34] + 0x10);
                *(int *)(local_c8 + 0x32) = iVar18;
                local_c8[0x33] = local_c8[0x33] + (long)iVar18;
                piVar7[6] = 0;
                iVar18 = 0;
              }
              goto LAB_0014bb86;
            }
          }
          else {
            uVar14 = *(ulong *)(piVar7 + 10) >> ((byte)(piVar7[0xc] + -0x10) & 0x3f);
            piVar7[0x4e] = (uint)uVar14 & 0xffff;
            if ((uVar14 & 0xffff) != 0) {
              piVar7[0xc] = piVar7[0xc] + -0x10;
              piVar7[0x2e] = piVar7[0x51];
              piVar7[0x30] = piVar7[0x52];
              piVar7[0x53] = 0;
              goto switchD_0014ad60_caseD_1;
            }
          }
          break;
        case 1:
switchD_0014ad60_caseD_1:
          if (((piVar7[0x30] <= piVar7[0xc]) ||
              (wVar11 = lzh_br_fillup(local_d0,br), wVar11 != L'\0')) ||
             (piVar7[0x30] <= piVar7[0xc])) {
            iVar18 = piVar7[0xc] - piVar7[0x30];
            piVar7[0x2f] = (uint)cache_masks[piVar7[0x30]] &
                           (uint)(*(ulong *)(piVar7 + 10) >> ((byte)iVar18 & 0x3f));
            piVar7[0xc] = iVar18;
            goto switchD_0014ad60_caseD_2;
          }
          if (lVar6 == local_d8) break;
          *piVar7 = 1;
LAB_0014ba74:
          iVar18 = 0;
          goto LAB_0014bb86;
        case 2:
switchD_0014ad60_caseD_2:
          wVar11 = piVar7[0x2f];
          if (wVar11 != L'\0') {
            wVar12 = hf->len_size;
            if (wVar12 < wVar11) break;
            piVar7[0x54] = 0;
            local_98[0x10] = 0;
            local_98[0xc] = 0;
            local_98[0xd] = 0;
            local_98[0xe] = 0;
            local_98[0xf] = 0;
            local_98[8] = 0;
            local_98[9] = 0;
            local_98[10] = 0;
            local_98[0xb] = 0;
            local_98[4] = 0;
            local_98[5] = 0;
            local_98[6] = 0;
            local_98[7] = 0;
            local_98[0] = 0;
            local_98[1] = 0;
            local_98[2] = 0;
            local_98[3] = 0;
            iVar18 = 4;
            if ((L'\x02' < wVar11) && (wVar12 != piVar7[0x4f])) goto switchD_0014ad60_caseD_3;
            goto LAB_0014b36b;
          }
          if (((piVar7[0xc] < piVar7[0x30]) &&
              (wVar11 = lzh_br_fillup(local_d0,br), wVar11 == L'\0')) &&
             (piVar7[0xc] < piVar7[0x30])) {
            if (lVar6 != local_d8) {
              *piVar7 = 2;
              goto LAB_0014ba74;
            }
          }
          else {
            uVar17 = (uint)(*(ulong *)(piVar7 + 10) >>
                           ((char)piVar7[0xc] - (char)piVar7[0x30] & 0x3fU)) &
                     (uint)cache_masks[piVar7[0x30]];
            if ((int)uVar17 < piVar7[0x2e]) {
              **(undefined2 **)(piVar7 + 0x4a) = (short)uVar17;
              piVar7[0x44] = 0;
              piVar7[0x45] = 0;
              *(undefined1 *)(*(long *)(piVar7 + 0x42) + (ulong)uVar17) = 0;
              piVar7[0xc] = piVar7[0xc] - piVar7[0x30];
              iVar18 = (uint)(piVar7[0x53] != 0) * 4 + 5;
              goto LAB_0014b36b;
            }
          }
          break;
        case 3:
switchD_0014ad60_caseD_3:
          wVar11 = lzh_read_pt_bitlen(local_d0,piVar7[0x54],L'\x03');
          piVar7[0x54] = wVar11;
          if (wVar11 < L'\x03') {
            if ((lVar6 != local_d8) && (L'\xffffffff' < wVar11)) {
LAB_0014ba6d:
              *piVar7 = 3;
              goto LAB_0014ba74;
            }
          }
          else if ((piVar7[0xc] < 2) &&
                  ((wVar11 = lzh_br_fillup(local_d0,br), wVar11 == L'\0' && (piVar7[0xc] < 2)))) {
            if (lVar6 != local_d8) goto LAB_0014ba6d;
          }
          else {
            uVar14 = *(ulong *)(piVar7 + 10) >> ((byte)(piVar7[0xc] + -2) & 0x3f);
            uVar17 = (uint)uVar14;
            piVar7[0xc] = piVar7[0xc] + -2;
            if ((int)(uVar17 & 3) <= piVar7[0x2f] + -3) {
              if ((uVar14 & 3) == 0) {
                lVar20 = 3;
              }
              else {
                lVar20 = 3;
                do {
                  *(undefined1 *)(*(long *)(piVar7 + 0x42) + lVar20) = 0;
                  lVar1 = lVar20 - (ulong)(uVar17 & 3);
                  lVar20 = lVar20 + 1;
                } while (lVar1 != 2);
              }
              piVar7[0x54] = (int)lVar20;
              goto switchD_0014ad60_caseD_4;
            }
          }
          break;
        case 4:
switchD_0014ad60_caseD_4:
          wVar11 = lzh_read_pt_bitlen(local_d0,piVar7[0x54],piVar7[0x2f]);
          piVar7[0x54] = wVar11;
          if (wVar11 < piVar7[0x2f]) {
            if ((lVar6 != local_d8) && (L'\xffffffff' < wVar11)) {
              *piVar7 = 4;
              goto LAB_0014ba74;
            }
          }
          else {
            wVar11 = lzh_make_huffman_table(hf);
            if (wVar11 != L'\0') {
              iVar18 = 9;
              if (piVar7[0x53] != 0) goto LAB_0014b36b;
              goto switchD_0014ad60_caseD_5;
            }
          }
          break;
        case 5:
switchD_0014ad60_caseD_5:
          if (((piVar7[0x10] <= piVar7[0xc]) ||
              (wVar11 = lzh_br_fillup(local_d0,br), wVar11 != L'\0')) ||
             (piVar7[0x10] <= piVar7[0xc])) {
            iVar18 = piVar7[0xc] - piVar7[0x10];
            piVar7[0xf] = (uint)cache_masks[piVar7[0x10]] &
                          (uint)(*(ulong *)(piVar7 + 10) >> ((byte)iVar18 & 0x3f));
            piVar7[0xc] = iVar18;
            goto switchD_0014ad60_caseD_6;
          }
          if (lVar6 != local_d8) {
            *piVar7 = 5;
            goto LAB_0014ba74;
          }
          break;
        case 6:
switchD_0014ad60_caseD_6:
          if (piVar7[0xf] == L'\0') {
            if (((piVar7[0xc] < piVar7[0x10]) &&
                (wVar11 = lzh_br_fillup(local_d0,br), wVar11 == L'\0')) &&
               (piVar7[0xc] < piVar7[0x10])) {
              if (lVar6 != local_d8) {
                *piVar7 = 6;
                goto LAB_0014ba74;
              }
            }
            else {
              uVar17 = (uint)(*(ulong *)(piVar7 + 10) >>
                             ((char)piVar7[0xc] - (char)piVar7[0x10] & 0x3fU)) &
                       (uint)cache_masks[piVar7[0x10]];
              if ((int)uVar17 < piVar7[0xe]) {
                **(undefined2 **)(piVar7 + 0x2a) = (short)uVar17;
                piVar7[0x24] = 0;
                piVar7[0x25] = 0;
                *(undefined1 *)(*(long *)(piVar7 + 0x22) + (ulong)uVar17) = 0;
                piVar7[0xc] = piVar7[0xc] - piVar7[0x10];
                iVar18 = 8;
                goto LAB_0014b36b;
              }
            }
          }
          else if (piVar7[0xf] <= phVar27->len_size) {
            piVar7[0x54] = 0;
            local_a0[0x10] = 0;
            local_a0[0xc] = 0;
            local_a0[0xd] = 0;
            local_a0[0xe] = 0;
            local_a0[0xf] = 0;
            local_a0[8] = 0;
            local_a0[9] = 0;
            local_a0[10] = 0;
            local_a0[0xb] = 0;
            local_a0[4] = 0;
            local_a0[5] = 0;
            local_a0[6] = 0;
            local_a0[7] = 0;
            local_a0[0] = 0;
            local_a0[1] = 0;
            local_a0[2] = 0;
            local_a0[3] = 0;
            goto switchD_0014ad60_caseD_7;
          }
          break;
        case 7:
switchD_0014ad60_caseD_7:
          iVar28 = piVar7[0x54];
          iVar18 = piVar7[0xf];
          while (hf = local_88, phVar27 = local_90, iVar28 < iVar18) {
            if (((piVar7[0xc] < piVar7[0x44]) &&
                (wVar11 = lzh_br_fillup(local_d0,br), wVar11 == L'\0')) &&
               (piVar7[0xc] < piVar7[0x44])) {
              if (lVar6 == local_d8) goto LAB_0014bb76;
              piVar7[0x54] = iVar28;
              *piVar7 = 7;
              goto LAB_0014ba74;
            }
            iVar18 = piVar7[0xc];
            uVar21 = (uint)cache_masks[piVar7[0x44]] &
                     (uint)(*(ulong *)(piVar7 + 10) >> ((char)iVar18 - (char)piVar7[0x44] & 0x3fU));
            uVar17 = piVar7[0x45];
            uVar3 = *(ushort *)
                     (*(long *)(piVar7 + 0x4a) + (ulong)(uVar21 >> ((byte)uVar17 & 0x1f)) * 2);
            uVar24 = (uint)uVar3;
            iVar19 = piVar7[0x2f];
            if (iVar19 == 0 || (int)(uint)uVar3 < iVar19) {
              uVar25 = (uint)uVar3;
            }
            else {
              do {
                uVar25 = 0;
                if (((int)uVar17 < 1) || (iVar23 = uVar24 - iVar19, piVar7[0x47] <= iVar23)) break;
                uVar17 = uVar17 - 1;
                puVar26 = (ushort *)(*(long *)(piVar7 + 0x4c) + 2 + (long)iVar23 * 4);
                if ((uVar21 >> (uVar17 & 0x1f) & 1) != 0) {
                  puVar26 = (ushort *)(*(long *)(piVar7 + 0x4c) + (long)iVar23 * 4);
                }
                uVar24 = (uint)*puVar26;
                uVar25 = uVar24;
              } while (iVar19 <= (int)uVar24);
            }
            if (uVar25 < 3) {
              if (uVar25 == 0) {
                piVar7[0xc] = iVar18 - (uint)**(byte **)(piVar7 + 0x42);
                uVar14 = 0;
                goto LAB_0014b289;
              }
              uVar17 = (uint)(uVar25 != 1) * 5 + 4;
              uVar14 = (ulong)uVar25;
              if (((iVar18 < (int)((uint)(uVar25 != 1) * 5 +
                                   (uint)*(byte *)(*(long *)(piVar7 + 0x42) + uVar14) + 4)) &&
                  (wVar11 = lzh_br_fillup(local_d0,br), wVar11 == L'\0')) &&
                 (piVar7[0xc] < (int)(*(byte *)(*(long *)(piVar7 + 0x42) + uVar14) + uVar17))) {
                iVar18 = 5;
                if (lVar6 != local_d8) {
                  piVar7[0x54] = iVar28;
                  *piVar7 = 7;
                  iVar18 = 1;
                }
              }
              else {
                iVar18 = (piVar7[0xc] - (uint)*(byte *)(*(long *)(piVar7 + 0x42) + uVar14)) - uVar17
                ;
                uVar21 = (uint)cache_masks[uVar17] &
                         (uint)(*(ulong *)(piVar7 + 10) >> ((byte)iVar18 & 0x3f));
                piVar7[0xc] = iVar18;
                uVar17 = uVar21 + 3;
                if (uVar25 != 1) {
                  uVar17 = uVar21 + 0x14;
                }
                iVar18 = 5;
                if ((int)(uVar17 + iVar28) <= piVar7[0xf]) {
                  iVar18 = 0;
                  memset((void *)((long)iVar28 + *(long *)(piVar7 + 0x22)),0,(ulong)uVar17);
                  iVar28 = uVar17 + iVar28;
                }
              }
              if (iVar18 != 0) {
                if (iVar18 == 5) goto LAB_0014bb76;
                goto LAB_0014ba74;
              }
            }
            else {
              piVar7[0xc] = iVar18 - (uint)*(byte *)(*(long *)(piVar7 + 0x42) + (ulong)uVar25);
              uVar14 = (ulong)(uVar25 - 2);
              piVar7[uVar14 + 0x11] = piVar7[uVar14 + 0x11] + 1;
LAB_0014b289:
              lVar20 = (long)iVar28;
              iVar28 = iVar28 + 1;
              *(char *)(*(long *)(piVar7 + 0x22) + lVar20) = (char)uVar14;
            }
            iVar18 = piVar7[0xf];
          }
          if ((iVar28 <= iVar18) && (wVar11 = lzh_make_huffman_table(local_90), wVar11 != L'\0'))
          goto switchD_0014ad60_caseD_8;
          break;
        case 8:
switchD_0014ad60_caseD_8:
          piVar7[0x2e] = piVar7[0x4f];
          piVar7[0x30] = piVar7[0x50];
          piVar7[0x53] = 1;
          iVar18 = 1;
LAB_0014b36b:
          *piVar7 = iVar18;
          goto switchD_0014ad60_default;
        case 9:
          goto switchD_0014ad60_caseD_9;
        default:
          goto switchD_0014ad60_default;
        }
LAB_0014bb76:
        piVar7[0x55] = -0x19;
        iVar18 = -0x19;
        goto LAB_0014bb86;
      }
LAB_0014bd2d:
      plVar4 = local_c8;
      if (iVar18 != 0) {
        if (iVar18 != 1) {
          archive_set_error(&a->archive,-1,"Bad lzh data");
          return L'\xffffffe7';
        }
        *(undefined1 *)((long)local_c8 + 300) = 1;
      }
      local_c8[2] = local_c8[0x30];
      local_c8[1] = local_c8[1] - local_c8[0x30];
      len = (size_t)(int)local_c8[0x32];
      *local_a8 = *local_c8;
      if (len != 0) {
        *local_80 = len;
        pvVar13 = (void *)local_c8[0x31];
        *local_b0 = pvVar13;
        uVar10 = lha_crc16(*(uint16_t *)(local_c8 + 3),pvVar13,len);
        *(uint16_t *)(plVar4 + 3) = uVar10;
        *plVar4 = *plVar4 + len;
        return L'\0';
      }
      *local_80 = 0;
      *local_b0 = (void *)0x0;
      if (*(char *)((long)local_c8 + 300) != '\0') {
        wVar11 = lha_end_of_entry(a);
        return wVar11;
      }
      return L'\0';
    }
    fmt = "Truncated LHa file body";
  }
  iVar18 = 0x54;
LAB_0014bfa0:
  archive_set_error(&a->archive,iVar18,fmt);
  return L'\xffffffe2';
LAB_0014b5e0:
  iVar28 = uVar25 - 0xfd;
  local_bc = iVar18;
switchD_0014b425_caseD_a:
  lVar20 = local_70;
  wVar11 = (wchar_t)local_70;
  if (((local_e8.cache_avail < wVar11) &&
      (wVar12 = lzh_br_fillup(local_d0,&local_e8), wVar12 == L'\0')) &&
     (local_e8.cache_avail < wVar11)) {
    if (lVar6 != local_d8) {
      piVar7[8] = iVar28;
      iVar19 = 10;
      iVar28 = local_bc;
      goto LAB_0014ba12;
    }
    uVar21 = (uint)cache_masks[local_70] &
             (uint)(local_e8.cache_buffer << ((char)local_70 - (char)local_e8.cache_avail & 0x3fU));
    uVar17 = piVar7[0x45];
    iVar18 = piVar7[0x2f];
    uVar3 = *(ushort *)(*(long *)(piVar7 + 0x4a) + (ulong)(uVar21 >> ((byte)uVar17 & 0x1f)) * 2);
    uVar24 = (uint)uVar3;
    if (iVar18 == 0 || (int)(uint)uVar3 < iVar18) {
      uVar22 = (ulong)uVar3;
    }
    else {
      do {
        uVar22 = 0;
        if (((int)uVar17 < 1) || (iVar23 = uVar24 - iVar18, piVar7[0x47] <= iVar23)) break;
        uVar17 = uVar17 - 1;
        puVar26 = (ushort *)(*(long *)(piVar7 + 0x4c) + 2 + (long)iVar23 * 4);
        if ((uVar21 >> (uVar17 & 0x1f) & 1) != 0) {
          puVar26 = (ushort *)(*(long *)(piVar7 + 0x4c) + (long)iVar23 * 4);
        }
        uVar24 = (uint)*puVar26;
        uVar22 = (ulong)uVar24;
      } while (iVar18 <= (int)uVar24);
    }
    uVar17 = (uint)uVar22;
    local_e8.cache_avail = local_e8.cache_avail - (uint)*(byte *)(local_78 + uVar22);
    if (local_e8.cache_avail < L'\0') goto LAB_0014ba89;
  }
  else {
    uVar21 = (uint)cache_masks[lVar20] &
             (uint)(local_e8.cache_buffer >> ((char)local_e8.cache_avail - (char)lVar20 & 0x3fU));
    uVar17 = piVar7[0x45];
    iVar18 = piVar7[0x2f];
    uVar3 = *(ushort *)(*(long *)(piVar7 + 0x4a) + (ulong)(uVar21 >> ((byte)uVar17 & 0x1f)) * 2);
    uVar24 = (uint)uVar3;
    if (iVar18 == 0 || (int)(uint)uVar3 < iVar18) {
      uVar22 = (ulong)uVar3;
    }
    else {
      do {
        uVar22 = 0;
        if (((int)uVar17 < 1) || (iVar23 = uVar24 - iVar18, piVar7[0x47] <= iVar23)) break;
        uVar17 = uVar17 - 1;
        puVar26 = (ushort *)(*(long *)(piVar7 + 0x4c) + 2 + (long)iVar23 * 4);
        if ((uVar21 >> (uVar17 & 0x1f) & 1) != 0) {
          puVar26 = (ushort *)(*(long *)(piVar7 + 0x4c) + (long)iVar23 * 4);
        }
        uVar24 = (uint)*puVar26;
        uVar22 = (ulong)uVar24;
      } while (iVar18 <= (int)uVar24);
    }
    uVar17 = (uint)uVar22;
    local_e8.cache_avail = local_e8.cache_avail - (uint)*(byte *)(local_78 + uVar22);
  }
switchD_0014b425_caseD_b:
  if (1 < (int)uVar17) {
    wVar11 = uVar17 + L'\xffffffff';
    if (((local_e8.cache_avail < wVar11) &&
        (wVar12 = lzh_br_fillup(local_d0,&local_e8), wVar12 == L'\0')) &&
       (local_e8.cache_avail < wVar11)) {
      iVar18 = 8;
      if (lVar6 != local_d8) {
        piVar7[8] = iVar28;
        piVar7[7] = uVar17;
        iVar18 = 7;
        iVar19 = 0xb;
      }
    }
    else {
      local_e8.cache_avail = local_e8.cache_avail - wVar11;
      uVar17 = ((uint)cache_masks[(uint)wVar11] &
               (uint)(local_e8.cache_buffer >> ((byte)local_e8.cache_avail & 0x3f))) +
               (1 << ((byte)wVar11 & 0x1f));
      iVar18 = 0;
    }
    if (iVar18 != 0) {
      iVar28 = local_bc;
      if (iVar18 != 7) {
        if (iVar18 != 8) goto LAB_0014bb86;
LAB_0014ba89:
        piVar7[0x55] = -0x19;
        iVar18 = -0x19;
        goto LAB_0014bb86;
      }
      goto LAB_0014ba12;
    }
  }
  uVar17 = ~uVar17 + (int)uVar14 & local_b4;
  uVar21 = local_b8;
switchD_0014b425_caseD_c:
  local_98 = (int *)CONCAT44(local_98._4_4_,iVar19);
  do {
    uVar25 = (uint)uVar14;
    uVar24 = uVar25;
    if ((int)uVar25 < (int)uVar17) {
      uVar24 = uVar17;
    }
    iVar23 = uVar21 - uVar24;
    iVar18 = iVar23;
    if (iVar28 < iVar23) {
      iVar18 = iVar28;
    }
    piVar15 = (int *)(long)(int)uVar25;
    uVar24 = iVar18 + uVar25;
    uVar14 = (ulong)uVar24;
    pvVar13 = (void *)((long)piVar15 + (long)(local_90->freq + -3));
    lVar20 = (long)(int)uVar17;
    __src = (void *)((long)local_90->freq + lVar20 + -0xc);
    local_88 = (huffman_conflict *)CONCAT44(local_88._4_4_,iVar18 + uVar17);
    if (((int)(iVar18 + uVar17) < (int)uVar25) || ((int)uVar24 < (int)uVar17)) {
      piVar15 = (int *)memcpy(pvVar13,__src,(long)iVar18);
      uVar21 = local_b8;
    }
    else {
      uVar22 = 0;
      if (1 < iVar18) {
        piVar15 = (int *)((long)piVar15 + (long)local_40);
        uVar22 = 0;
        do {
          *(undefined1 *)((long)piVar15 + (uVar22 - 1)) = local_40[uVar22 + lVar20 + -1];
          *(undefined1 *)((long)piVar15 + uVar22) = local_40[uVar22 + lVar20];
          uVar22 = uVar22 + 2;
        } while ((long)uVar22 < (long)(iVar18 + -1));
      }
      if ((int)uVar22 < iVar18) {
        piVar15 = (int *)(uVar22 & 0xffffffff);
        *(undefined1 *)((long)pvVar13 + (long)piVar15) =
             *(undefined1 *)((long)__src + (long)piVar15);
      }
    }
    if (uVar24 == uVar21) {
      local_c8[0x31] = *(long *)(local_c8[0x34] + 0x10);
      *(uint *)(local_c8 + 0x32) = uVar21;
      local_c8[0x33] = local_c8[0x33] + (long)local_a0;
      iVar19 = 7;
      local_98 = (int *)CONCAT44(local_98._4_4_,9);
      uVar14 = 0;
      piVar15 = local_a0;
      if (iVar23 < iVar28) {
        piVar7[8] = iVar28 - iVar18;
        piVar15 = (int *)(ulong)((uint)local_88 & local_b4);
        piVar7[7] = (uint)local_88 & local_b4;
        local_98 = (int *)CONCAT44(local_98._4_4_,0xc);
      }
    }
    else {
      iVar19 = 9;
      if (iVar23 < iVar28) {
        iVar28 = iVar28 - iVar18;
        uVar17 = (uint)local_88 & local_b4;
        piVar15 = (int *)(ulong)uVar17;
        iVar19 = 0;
      }
    }
    iVar18 = (int)piVar15;
  } while (iVar19 == 0);
  if (iVar19 != 7) {
    if (iVar19 != 9) goto LAB_0014bb86;
    goto switchD_0014b425_default;
  }
  iVar19 = (int)local_98;
  iVar28 = local_bc;
LAB_0014ba12:
  *local_68 = (int)local_e8.cache_buffer;
  local_68[1] = local_e8.cache_buffer._4_4_;
  local_68[2] = local_e8.cache_avail;
  local_68[3] = local_e8._12_4_;
  piVar7[0x4e] = iVar28;
  *piVar7 = iVar19;
  piVar7[6] = (int)uVar14;
  iVar18 = 0;
  goto LAB_0014bb86;
switchD_0014ad60_caseD_9:
  iVar18 = 100;
LAB_0014bb86:
  if (iVar18 != 100) goto LAB_0014bd0f;
  goto LAB_0014ad03;
LAB_0014bd0f:
  local_c8[0x30] = local_c8[0x30] + ((long)iVar16 - (long)(int)local_c8[0x2f]);
  a = local_50;
  goto LAB_0014bd2d;
}

Assistant:

static int
archive_read_format_lha_read_data(struct archive_read *a,
    const void **buff, size_t *size, int64_t *offset)
{
	struct lha *lha = (struct lha *)(a->format->data);
	int r;

	if (lha->entry_unconsumed) {
		/* Consume as much as the decompressor actually used. */
		__archive_read_consume(a, lha->entry_unconsumed);
		lha->entry_unconsumed = 0;
	}
	if (lha->end_of_entry) {
		*offset = lha->entry_offset;
		*size = 0;
		*buff = NULL;
		return (lha_end_of_entry(a));
	}

	if (lha->entry_is_compressed)
		r =  lha_read_data_lzh(a, buff, size, offset);
	else
		/* No compression. */
		r =  lha_read_data_none(a, buff, size, offset);
	return (r);
}